

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O1

bool anon_unknown.dwarf_1828440::isSameEnum(Expression *expr,Type *enumType)

{
  bool bVar1;
  
  while( true ) {
    if (*(int *)expr != 0xc) {
      bVar1 = slang::ast::Type::isMatching(*(Type **)((long)expr + 8),enumType);
      return bVar1;
    }
    bVar1 = isSameEnum((Expression *)((Expression *)((long)expr + 0x30))->syntax,enumType);
    if (!bVar1) break;
    expr = *(Expression **)&(((Expression *)((long)expr + 0x30))->sourceRange).startLoc;
  }
  return false;
}

Assistant:

bool isSameEnum(const Expression& expr, const Type& enumType) {
    if (expr.kind == ExpressionKind::ConditionalOp) {
        auto& cond = expr.as<ConditionalExpression>();
        return isSameEnum(cond.left(), enumType) && isSameEnum(cond.right(), enumType);
    }
    return expr.type->isMatching(enumType);
}